

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O0

uint64_t highwayhash::(anonymous_namespace)::RunHighwayCat<4u>(void *param_1,size_t size)

{
  HHResult64 result;
  size_t half_size;
  char in [1024];
  HighwayHashCatT<4U> cat;
  uint64_t local_550;
  unsigned_long *in_stack_fffffffffffffb18;
  HighwayHashCatT<4U> *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  HighwayHashCatT<4U> *in_stack_fffffffffffffb40;
  HighwayHashCatT<4U> local_140;
  
  HighwayHashCatT<4U>::HighwayHashCatT(&local_140,&anon_unknown_1::RunHighwayCat<4U>::key);
  HighwayHashCatT<4U>::Append
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  HighwayHashCatT<4U>::Append
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  HighwayHashCatT<4U>::Finalize<unsigned_long>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  return local_550;
}

Assistant:

uint64_t RunHighwayCat(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  HH_ALIGNAS(64) HighwayHashCatT<Target> cat(key);
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  const size_t half_size = size / 2;
  cat.Append(in, half_size);
  cat.Append(in + half_size, size - half_size);
  HHResult64 result;
  cat.Finalize(&result);
  return result;
}